

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::MergeNewHeapBlock(HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
                    *this,SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>
                          *heapBlock)

{
  uint32 *puVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  undefined8 *in_FS_OFFSET;
  
  if ((this->super_HeapBucket).sizeCat !=
      (uint)(heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
            super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
            super_SmallHeapBlockT<MediumAllocationBlockAttributes>.objectSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x646,"(heapBlock->GetObjectSize() == this->sizeCat)",
                       "heapBlock->GetObjectSize() == this->sizeCat");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  (heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
  super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
  super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next =
       (SmallHeapBlockT<MediumAllocationBlockAttributes> *)this->heapBlockList;
  this->heapBlockList = heapBlock;
  LOCK();
  puVar1 = &(this->super_HeapBucket).newHeapBlockCount;
  *puVar1 = *puVar1 - 1;
  UNLOCK();
  puVar1 = &(this->super_HeapBucket).heapBlockCount;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::MergeNewHeapBlock(TBlockType * heapBlock)
{
    Assert(heapBlock->GetObjectSize() == this->sizeCat);
    heapBlock->SetNextBlock(this->heapBlockList);
    this->heapBlockList = heapBlock;
#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    ::InterlockedDecrement(&this->newHeapBlockCount);
    this->heapBlockCount++;
#endif
}